

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O0

int Abc_CascadeExperiment
              (char *pFileGeneric,DdManager *dd,DdNode **pOutputs,int nInputs,int nOutputs,
              int nLutSize,int fCheck,int fVerbose)

{
  int iVar1;
  int nNames_00;
  uint uVar2;
  DdNode *pDVar3;
  char *pcVar4;
  abctime aVar5;
  abctime aVar6;
  Abc_Frame_t *pAbc;
  char local_42e8 [8];
  char Command [300];
  char Buffer [100];
  char local_4148 [8];
  char FileNameFin [100];
  char local_40d8 [8];
  char FileNameIni [100];
  DdNode *aFunc;
  char *pNames [1024];
  int nNames;
  DdNode *pbVarsEnc [1024];
  int nVarsEnc;
  abctime clk1;
  int nOuts;
  int nVars;
  int i;
  int nLutSize_local;
  int nOutputs_local;
  int nInputs_local;
  DdNode **pOutputs_local;
  DdManager *dd_local;
  char *pFileGeneric_local;
  
  strcpy(local_40d8,pFileGeneric);
  strcat(local_40d8,"_ENC.blif");
  strcpy(local_4148,pFileGeneric);
  strcat(local_4148,"_LUT.blif");
  iVar1 = Abc_Base2Log(nOutputs);
  for (nOuts = 0; nOuts < iVar1; nOuts = nOuts + 1) {
    pDVar3 = Cudd_bddNewVarAtLevel(dd,nOuts);
    *(DdNode **)(&stack0xffffffffffffdfa8 + (long)nOuts * 8) = pDVar3;
  }
  nNames_00 = nInputs + iVar1;
  for (nOuts = 0; nOuts < nInputs; nOuts = nOuts + 1) {
    sprintf(Command + 0x128,"pi%03d",(ulong)(uint)nOuts);
    pcVar4 = Extra_UtilStrsav(Command + 0x128);
    pNames[(long)nOuts + -1] = pcVar4;
  }
  for (; nOuts < nNames_00; nOuts = nOuts + 1) {
    sprintf(Command + 0x128,"OutEnc_%02d",(ulong)(uint)(nOuts - nInputs));
    pcVar4 = Extra_UtilStrsav(Command + 0x128);
    pNames[(long)nOuts + -1] = pcVar4;
  }
  Abc_Clock();
  register0x00000000 =
       GetSingleOutputFunction
                 (dd,pOutputs,nOutputs,(DdNode **)&stack0xffffffffffffdfa8,iVar1,fVerbose);
  Cudd_Ref(register0x00000000);
  aVar5 = Abc_Clock();
  Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,1);
  Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,1);
  if (fVerbose != 0) {
    uVar2 = Cudd_DagSize(stack0xffffffffffffbf90);
    printf("MTBDD reordered = %6d nodes\n",(ulong)uVar2);
    aVar6 = Abc_Clock();
    printf("Variable reordering time = %.2f sec\n",(double)((float)(aVar6 - aVar5) / 1e+06));
  }
  Abc_Clock();
  if (fCheck != 0) {
    WriteSingleOutputFunctionBlif(dd,stack0xffffffffffffbf90,(char **)&aFunc,nNames_00,local_40d8);
  }
  iVar1 = CreateDecomposedNetwork
                    (dd,stack0xffffffffffffbf90,(char **)&aFunc,nNames_00,local_4148,nLutSize,fCheck
                     ,fVerbose);
  if (iVar1 == 0) {
    pFileGeneric_local._4_4_ = 0;
  }
  else {
    if (fCheck != 0) {
      sprintf(local_42e8,"cec %s %s",local_40d8,local_4148);
      pAbc = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAbc,local_42e8);
    }
    Cudd_RecursiveDeref(dd,stack0xffffffffffffbf90);
    for (nOuts = 0; nOuts < nNames_00; nOuts = nOuts + 1) {
      if (pNames[(long)nOuts + -1] != (char *)0x0) {
        free(pNames[(long)nOuts + -1]);
        pNames[(long)nOuts + -1] = (char *)0x0;
      }
    }
    pFileGeneric_local._4_4_ = 1;
  }
  return pFileGeneric_local._4_4_;
}

Assistant:

int Abc_CascadeExperiment( char * pFileGeneric, DdManager * dd, DdNode ** pOutputs, int nInputs, int nOutputs, int nLutSize, int fCheck, int fVerbose )
{
    int i;
    int nVars = nInputs;
    int nOuts = nOutputs;
    abctime clk1;

    int      nVarsEnc;              // the number of additional variables to encode outputs
    DdNode * pbVarsEnc[MAXOUTPUTS]; // the BDDs of the encoding vars

    int      nNames;               // the total number of all inputs
    char *   pNames[MAXINPUTS];     // the temporary storage for the input (and output encoding) names

    DdNode * aFunc;                 // the encoded 0-1 BDD containing all the outputs

    char FileNameIni[100];
    char FileNameFin[100];
    char Buffer[100];

    
//pTable = fopen( "stats.txt", "a+" );
//fprintf( pTable, "%s ", pFileGeneric );
//fprintf( pTable, "%d ", nVars );
//fprintf( pTable, "%d ", nOuts );


    // assign the file names
    strcpy( FileNameIni, pFileGeneric );
    strcat( FileNameIni, "_ENC.blif" );

    strcpy( FileNameFin, pFileGeneric );
    strcat( FileNameFin, "_LUT.blif" );


    // create the variables to encode the outputs
    nVarsEnc = Abc_Base2Log( nOuts );
    for ( i = 0; i < nVarsEnc; i++ )
        pbVarsEnc[i] = Cudd_bddNewVarAtLevel( dd, i );


    // store the input names
    nNames  = nVars + nVarsEnc;
    for ( i = 0; i < nVars; i++ )
    {
//      pNames[i] = Extra_UtilStrsav( pFunc->pInputNames[i] );
        sprintf( Buffer, "pi%03d", i );
        pNames[i] = Extra_UtilStrsav( Buffer );
    }
    // set the encoding variable name
    for ( ; i < nNames; i++ )
    {       
        sprintf( Buffer, "OutEnc_%02d", i-nVars );
        pNames[i] = Extra_UtilStrsav( Buffer );
    }


    // print the variable order
//  printf( "\n" );
//  printf( "Variable order is: " );
//  for ( i = 0; i < dd->size; i++ )
//      printf( " %d", dd->invperm[i] );
//  printf( "\n" );

    // derive the single-output function
    clk1 = Abc_Clock();
    aFunc = GetSingleOutputFunction( dd, pOutputs, nOuts, pbVarsEnc, nVarsEnc, fVerbose );  Cudd_Ref( aFunc );
//  aFunc = GetSingleOutputFunctionRemapped( dd, pOutputs, nOuts, pbVarsEnc, nVarsEnc );  Cudd_Ref( aFunc );
//  if ( fVerbose )
//  printf( "Single-output function computation time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
 
//fprintf( pTable, "%d ", Cudd_SharingSize( pOutputs, nOutputs ) );
//fprintf( pTable, "%d ", Extra_ProfileWidthSharingMax(dd, pOutputs, nOutputs) );

    // dispose of the multiple-output function
//  Extra_Dissolve( pFunc );
 
    // reorder the single output function
//    if ( fVerbose )
//  printf( "Reordering variables...\n");
    clk1 = Abc_Clock();
//  if ( fVerbose )
//  printf( "Node count before = %6d\n", Cudd_DagSize( aFunc ) );
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SIFT,1);
    Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
    Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
    if ( fVerbose )
    printf( "MTBDD reordered = %6d nodes\n", Cudd_DagSize( aFunc ) );
    if ( fVerbose )
    printf( "Variable reordering time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
//  printf( "\n" );
//  printf( "Variable order is: " );
//  for ( i = 0; i < dd->size; i++ )
//      printf( " %d", dd->invperm[i] );
//  printf( "\n" );
//fprintf( pTable, "%d ", Cudd_DagSize( aFunc ) );
//fprintf( pTable, "%d ", Extra_ProfileWidthMax(dd, aFunc) );

    // write the single-output function into BLIF for verification
    clk1 = Abc_Clock();
    if ( fCheck )
    WriteSingleOutputFunctionBlif( dd, aFunc, pNames, nNames, FileNameIni );
//    if ( fVerbose )
//  printf( "Single-output function writing time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );

/*
    ///////////////////////////////////////////////////////////////////
    // verification of single output function
    clk1 = Abc_Clock();
    {
        BFunc g_Func;
        DdNode * aRes;

        g_Func.dd = dd;
        g_Func.FileInput = Extra_UtilStrsav(FileNameIni);

        if ( Extra_ReadFile( &g_Func ) == 0 )
        {
            printf( "\nSomething did not work out while reading the input file for verification\n");
            Extra_Dissolve( &g_Func );
            return;
        } 

        aRes = Cudd_BddToAdd( dd, g_Func.pOutputs[0] );  Cudd_Ref( aRes );

        if ( aRes != aFunc )
            printf( "\nVerification FAILED!\n");
        else
            printf( "\nVerification okay!\n");
        
        Cudd_RecursiveDeref( dd, aRes );

        // delocate
        Extra_Dissolve( &g_Func );
    }
    printf( "Preliminary verification time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
    ///////////////////////////////////////////////////////////////////
*/

    if ( !CreateDecomposedNetwork( dd, aFunc, pNames, nNames, FileNameFin, nLutSize, fCheck, fVerbose ) )
        return 0;

/*
    ///////////////////////////////////////////////////////////////////
    // verification of the decomposed LUT network
    clk1 = Abc_Clock();
    {
        BFunc g_Func;
        DdNode * aRes;

        g_Func.dd = dd;
        g_Func.FileInput = Extra_UtilStrsav(FileNameFin);

        if ( Extra_ReadFile( &g_Func ) == 0 )
        {
            printf( "\nSomething did not work out while reading the input file for verification\n");
            Extra_Dissolve( &g_Func );
            return;
        } 

        aRes = Cudd_BddToAdd( dd, g_Func.pOutputs[0] );  Cudd_Ref( aRes );

        if ( aRes != aFunc )
            printf( "\nFinal verification FAILED!\n");
        else
            printf( "\nFinal verification okay!\n");
        
        Cudd_RecursiveDeref( dd, aRes );
 
        // delocate 
        Extra_Dissolve( &g_Func );
    }
    printf( "Final verification time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
    ///////////////////////////////////////////////////////////////////
*/
 
    // verify the results
    if ( fCheck )
    {
        char Command[300];
        sprintf( Command, "cec %s %s", FileNameIni, FileNameFin );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
    }

    Cudd_RecursiveDeref( dd, aFunc );

    // release the names
    for ( i = 0; i < nNames; i++ )
        ABC_FREE( pNames[i] );


//fprintf( pTable, "\n" );
//fclose( pTable );

    return 1;
}